

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckStencil(BlitTest *this)

{
  ostringstream *this_00;
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  GLint stencil [2] [3];
  int local_1b8 [6];
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  lVar6 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x1220))(0,0,3,2,0x1901,0x1404,local_1b8);
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xbc1);
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar5 = 0;
    do {
      iVar4 = CheckStencil::reference[lVar6][lVar5];
      iVar1 = local_1b8[lVar6 * 3 + lVar5];
      if (iVar4 != iVar1) {
        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Blitted framebuffer stencil buffer contains [",0x2d);
        std::ostream::operator<<(this_00,local_1b8[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,local_1b8[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,local_1b8[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", \n",3);
        std::ostream::operator<<(this_00,local_1b8[3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,local_1b8[4]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,local_1b8[5]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], but ",7);
        std::ostream::operator<<(this_00,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", \n",3);
        std::ostream::operator<<(this_00,4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] was expected.",0xf)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_128);
        goto LAB_00a9ba3f;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar6 = 1;
    bVar2 = false;
  } while (bVar3);
LAB_00a9ba3f:
  return iVar4 == iVar1;
}

Assistant:

bool BlitTest::CheckStencil()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLint reference[2][3] = { { 1, 2, 3 }, { 4, 4, 4 } };

	/* Copy buffer. */
	glw::GLint stencil[2][3] = { { 0 } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_STENCIL_INDEX, GL_INT, stencil);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			if (reference[j][i] != stencil[j][i])
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Blitted framebuffer stencil buffer contains [" << stencil[0][0] << ", "
					<< stencil[0][1] << ", " << stencil[0][2] << ", \n"
					<< stencil[1][0] << ", " << stencil[1][1] << ", " << stencil[1][2] << "], but " << reference[0][0]
					<< ", " << reference[0][1] << ", " << reference[0][2] << ", \n"
					<< reference[1][0] << ", " << reference[1][1] << ", " << reference[1][2] << "] was expected."
					<< tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}